

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O0

ArrayPtr<capnp::word> __thiscall
capnp::MallocMessageBuilder::allocateSegment(MallocMessageBuilder *this,uint minimumSize)

{
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  unsigned_long_long uVar4;
  ArrayPtr<capnp::word> AVar5;
  int local_d8;
  Fault local_c0;
  Fault f_2;
  void *result;
  uint size;
  Fault f_1;
  undefined1 local_98 [8];
  DebugComparison<unsigned_int,_const_unsigned_long_long_&> _kjCondition_1;
  Fault local_60;
  Fault f;
  undefined1 local_50 [8];
  DebugComparison<unsigned_int,_const_unsigned_long_long_&> _kjCondition;
  uint minimumSize_local;
  MallocMessageBuilder *this_local;
  ArrayPtr<capnp::word> result_1;
  
  _kjCondition._36_4_ = minimumSize;
  f.exception._0_4_ = bounded<unsigned_int>(minimumSize);
  f.exception._4_4_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(uint *)&f);
  kj::_::DebugExpression<unsigned_int>::operator<=
            ((DebugComparison<unsigned_int,_const_unsigned_long_long_&> *)local_50,
             (DebugExpression<unsigned_int> *)((long)&f.exception + 4),&MAX_SEGMENT_WORDS);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long_long_const&>&,char_const(&)[80]>
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message.c++"
               ,0xfa,FAILED,"bounded(minimumSize) * WORDS <= MAX_SEGMENT_WORDS",
               "_kjCondition,\"MallocMessageBuilder asked to allocate segment above maximum serializable size.\""
               ,(DebugComparison<unsigned_int,_const_unsigned_long_long_&> *)local_50,
               (char (*) [80])
               "MallocMessageBuilder asked to allocate segment above maximum serializable size.");
    kj::_::Debug::Fault::fatal(&local_60);
  }
  f_1.exception._0_4_ = bounded<unsigned_int>(*(uint *)&(this->super_MessageBuilder).field_0xbc);
  f_1.exception._4_4_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(uint *)&f_1);
  kj::_::DebugExpression<unsigned_int>::operator<=
            ((DebugComparison<unsigned_int,_const_unsigned_long_long_&> *)local_98,
             (DebugExpression<unsigned_int> *)((long)&f_1.exception + 4),&MAX_SEGMENT_WORDS);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_98);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long_long_const&>&,char_const(&)[45]>
              ((Fault *)&stack0xffffffffffffff58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message.c++"
               ,0xfc,FAILED,"bounded(nextSize) * WORDS <= MAX_SEGMENT_WORDS",
               "_kjCondition,\"MallocMessageBuilder nextSize out of bounds.\"",
               (DebugComparison<unsigned_int,_const_unsigned_long_long_&> *)local_98,
               (char (*) [45])"MallocMessageBuilder nextSize out of bounds.");
    kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff58);
  }
  if (((this->returnedFirstSegment & 1U) == 0) && ((this->ownFirstSegment & 1U) == 0)) {
    _this_local = kj::arrayPtr<capnp::word>
                            ((word *)this->firstSegment,
                             (ulong)*(uint *)&(this->super_MessageBuilder).field_0xbc);
    sVar2 = kj::ArrayPtr<capnp::word>::size((ArrayPtr<capnp::word> *)&this_local);
    if ((uint)_kjCondition._36_4_ <= sVar2) {
      this->returnedFirstSegment = true;
      return _this_local;
    }
    this->ownFirstSegment = true;
  }
  result._4_4_ = kj::max<unsigned_int&,unsigned_int&>
                           ((uint *)&_kjCondition.field_0x24,
                            (uint *)&(this->super_MessageBuilder).field_0xbc);
  f_2.exception = (Exception *)calloc((ulong)result._4_4_,8);
  if (f_2.exception != (Exception *)0x0) {
    if ((this->returnedFirstSegment & 1U) == 0) {
      this->firstSegment = f_2.exception;
      this->returnedFirstSegment = true;
      if (this->allocationStrategy == GROW_HEURISTICALLY) {
        *(WiderType<Decay<unsigned_int_&>,_Decay<unsigned_int_&>_> *)
         &(this->super_MessageBuilder).field_0xbc = result._4_4_;
      }
    }
    else {
      kj::Vector<void*>::add<void*&>((Vector<void*> *)&this->moreSegments,&f_2.exception);
      if (this->allocationStrategy == GROW_HEURISTICALLY) {
        uVar3 = (ulong)result._4_4_;
        uVar4 = unbound<unsigned_long_long>(0x1fffffff);
        if (uVar4 - *(uint *)&(this->super_MessageBuilder).field_0xbc < uVar3) {
          uVar4 = unbound<unsigned_long_long>(0x1fffffff);
          local_d8 = (int)uVar4;
        }
        else {
          local_d8 = *(int *)&(this->super_MessageBuilder).field_0xbc + result._4_4_;
        }
        *(int *)&(this->super_MessageBuilder).field_0xbc = local_d8;
      }
    }
    AVar5 = kj::arrayPtr<capnp::word>((word *)f_2.exception,(ulong)result._4_4_);
    return AVar5;
  }
  kj::_::Debug::Fault::Fault<int,unsigned_int&>
            (&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message.c++"
             ,0x10e,0xc,"calloc(size, sizeof(word))","size",(uint *)((long)&result + 4));
  kj::_::Debug::Fault::fatal(&local_c0);
}

Assistant:

kj::ArrayPtr<word> MallocMessageBuilder::allocateSegment(uint minimumSize) {
  KJ_REQUIRE(bounded(minimumSize) * WORDS <= MAX_SEGMENT_WORDS,
      "MallocMessageBuilder asked to allocate segment above maximum serializable size.");
  KJ_ASSERT(bounded(nextSize) * WORDS <= MAX_SEGMENT_WORDS,
      "MallocMessageBuilder nextSize out of bounds.");

  if (!returnedFirstSegment && !ownFirstSegment) {
    kj::ArrayPtr<word> result = kj::arrayPtr(reinterpret_cast<word*>(firstSegment), nextSize);
    if (result.size() >= minimumSize) {
      returnedFirstSegment = true;
      return result;
    }
    // If the provided first segment wasn't big enough, we discard it and proceed to allocate
    // our own.  This never happens in practice since minimumSize is always 1 for the first
    // segment.
    ownFirstSegment = true;
  }

  uint size = kj::max(minimumSize, nextSize);

  void* result = calloc(size, sizeof(word));
  if (result == nullptr) {
    KJ_FAIL_SYSCALL("calloc(size, sizeof(word))", ENOMEM, size);
  }

  if (!returnedFirstSegment) {
    firstSegment = result;
    returnedFirstSegment = true;

    // After the first segment, we want nextSize to equal the total size allocated so far.
    if (allocationStrategy == AllocationStrategy::GROW_HEURISTICALLY) nextSize = size;
  } else {
    moreSegments.add(result);
    if (allocationStrategy == AllocationStrategy::GROW_HEURISTICALLY) {
      // set nextSize = min(nextSize+size, MAX_SEGMENT_WORDS)
      // while protecting against possible overflow of (nextSize+size)
      nextSize = (size <= unbound(MAX_SEGMENT_WORDS / WORDS) - nextSize)
          ? nextSize + size : unbound(MAX_SEGMENT_WORDS / WORDS);
    }
  }

  return kj::arrayPtr(reinterpret_cast<word*>(result), size);
}